

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseConstList(WastParser *this,ConstVector *consts,ConstType type)

{
  pointer *ppCVar1;
  bool bVar2;
  TokenType TVar3;
  Result RVar4;
  long lVar5;
  Const *pCVar6;
  iterator __position;
  byte bVar7;
  Type type_1;
  Token token;
  Type local_110;
  Const local_108;
  Token local_b0;
  Token local_70;
  
  bVar7 = 0;
  do {
    bVar2 = PeekMatchLpar(this,Const);
    if ((((!bVar2) && (bVar2 = PeekMatchLpar(this,RefNull), !bVar2)) &&
        (bVar2 = PeekMatchLpar(this,RefExtern), !bVar2)) &&
       (bVar2 = PeekMatchLpar(this,RefFunc), !bVar2)) {
      return (Result)Ok;
    }
    Consume((Token *)&local_108,this);
    local_108.loc.field_1.field_0.line = 0;
    local_108.loc.field_1.field_0.first_column = 0;
    local_108.loc.field_1.field_0.last_column = 0;
    local_108.loc.filename._M_len = 0;
    local_108.loc.filename._M_str._0_4_ = 0;
    local_108.loc.filename._M_str._4_4_ = 0;
    local_108.type_.enum_ = I32;
    local_108.type_.type_index_ = 0;
    local_108.data_.v._0_8_ = local_108.data_.v._0_8_ & 0xffffffff00000000;
    local_108.nan_[0] = None;
    TVar3 = Peek(this,0);
    if ((int)TVar3 < 0x67) {
      if (TVar3 == Const) {
        RVar4 = ParseConst(this,&local_108,type);
      }
      else {
        if (TVar3 != RefExtern) {
LAB_001638fb:
          __assert_fail("!\"unreachable\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                        ,0xbd8,"Result wabt::WastParser::ParseConstList(ConstVector *, ConstType)");
        }
        RVar4 = ParseExternref(this,&local_108);
      }
      if (RVar4.enum_ == Error) {
        return (Result)Error;
      }
    }
    else {
      if (TVar3 == RefFunc) {
        Consume(&local_70,this);
        ErrorUnlessOpcodeEnabled(this,&local_70);
        GetToken(&local_b0,this);
        local_108.loc.field_1.field_0.line = local_b0.loc.field_1._0_4_;
        local_108.loc.field_1.field_0.first_column = local_b0.loc.field_1._4_4_;
        local_108.loc.field_1.field_0.last_column = (int)local_b0.loc.field_1._8_8_;
        local_108.loc.field_1._12_4_ = (undefined4)((ulong)local_b0.loc.field_1._8_8_ >> 0x20);
        local_108.loc.filename._M_str._0_4_ = SUB84(local_b0.loc.filename._M_str,0);
        local_108.loc.filename._M_str._4_4_ =
             (undefined4)((ulong)local_b0.loc.filename._M_str >> 0x20);
        local_108.type_.enum_ = FuncRef;
        local_108.type_.type_index_ = 0;
        local_108.data_.v[0] = '\0';
        local_108.data_.v[1] = '\0';
        local_108.data_.v[2] = '\0';
        local_108.data_.v[3] = '\0';
        local_108.data_.v[4] = '\0';
        local_108.data_.v[5] = '\0';
        local_108.data_.v[6] = '\0';
        local_108.data_.v[7] = '\0';
      }
      else {
        if (TVar3 != RefNull) goto LAB_001638fb;
        Consume(&local_70,this);
        RVar4 = ParseRefKind(this,&local_110);
        if (RVar4.enum_ == Error) {
          return (Result)Error;
        }
        ErrorUnlessOpcodeEnabled(this,&local_70);
        GetToken(&local_b0,this);
        local_108.loc.field_1.field_0.line = local_b0.loc.field_1._0_4_;
        local_108.loc.field_1.field_0.first_column = local_b0.loc.field_1._4_4_;
        local_108.loc.field_1.field_0.last_column = (int)local_b0.loc.field_1._8_8_;
        local_108.loc.field_1._12_4_ = (undefined4)((ulong)local_b0.loc.field_1._8_8_ >> 0x20);
        local_108.loc.filename._M_str._0_4_ = SUB84(local_b0.loc.filename._M_str,0);
        local_108.loc.filename._M_str._4_4_ =
             (undefined4)((ulong)local_b0.loc.filename._M_str >> 0x20);
        local_108.type_ = local_110;
        local_108.data_.v[0] = 0xff;
        local_108.data_.v[1] = 0xff;
        local_108.data_.v[2] = 0xff;
        local_108.data_.v[3] = 0xff;
        local_108.data_.v[4] = 0xff;
        local_108.data_.v[5] = 0xff;
        local_108.data_.v[6] = 0xff;
        local_108.data_.v[7] = 0xff;
      }
      local_108.nan_[0] = None;
      local_108.loc.filename._M_len = local_b0.loc.filename._M_len;
    }
    RVar4 = Expect(this,Rpar);
    if (RVar4.enum_ == Error) {
      return (Result)Error;
    }
    __position._M_current =
         (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::Const,std::allocator<wabt::Const>>::_M_realloc_insert<wabt::Const_const&>
                ((vector<wabt::Const,std::allocator<wabt::Const>> *)consts,__position,&local_108);
    }
    else {
      pCVar6 = &local_108;
      for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
        ((__position._M_current)->loc).filename._M_len = (pCVar6->loc).filename._M_len;
        pCVar6 = (Const *)((long)pCVar6 + (ulong)bVar7 * -0x10 + 8);
        __position._M_current = __position._M_current + (ulong)bVar7 * -0x10 + 8;
      }
      ppCVar1 = &(consts->super__Vector_base<wabt::Const,_std::allocator<wabt::Const>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppCVar1 = *ppCVar1 + 1;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseConstList(ConstVector* consts, ConstType type) {
  WABT_TRACE(ParseConstList);
  while (PeekMatchLpar(TokenType::Const) || PeekMatchLpar(TokenType::RefNull) ||
         PeekMatchLpar(TokenType::RefExtern) ||
         PeekMatchLpar(TokenType::RefFunc)) {
    Consume();
    Const const_;
    switch (Peek()) {
      case TokenType::Const:
        CHECK_RESULT(ParseConst(&const_, type));
        break;
      case TokenType::RefNull: {
        auto token = Consume();
        Type type;
        CHECK_RESULT(ParseRefKind(&type));
        ErrorUnlessOpcodeEnabled(token);
        const_.loc = GetLocation();
        const_.set_null(type);
        break;
      }
      case TokenType::RefFunc: {
        auto token = Consume();
        ErrorUnlessOpcodeEnabled(token);
        const_.loc = GetLocation();
        const_.set_funcref();
        break;
      }
      case TokenType::RefExtern:
        CHECK_RESULT(ParseExternref(&const_));
        break;
      default:
        assert(!"unreachable");
        return Result::Error;
    }
    EXPECT(Rpar);
    consts->push_back(const_);
  }

  return Result::Ok;
}